

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::powExpr(Parser *this)

{
  Lexer *pLVar1;
  Report *this_00;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  Opcode OVar4;
  LiteralType args;
  LiteralType args_2;
  _Base_ptr p_Var5;
  Parser *in_RSI;
  undefined1 local_a8 [12];
  Opcode opc;
  _Base_ptr local_98;
  _Base_ptr local_90;
  string local_88;
  SourceLocation sloc;
  
  SourceLocation::SourceLocation
            (&sloc,&((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  negExpr((Parser *)local_a8);
  if ((_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_a8._0_8_
      == (Expr *)0x0) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
    p_Var5 = *(_Base_ptr *)&(this->features_)._M_t._M_impl;
    do {
      if (((in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_ != Pow) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = local_a8._0_8_;
        goto LAB_00121d53;
      }
      nextToken(in_RSI);
      powExpr((Parser *)&stack0xffffffffffffff68);
      if (local_98 == (_Base_ptr)0x0) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        goto LAB_00121d43;
      }
      OVar4 = makeOperator(Pow,(Expr *)local_a8._0_8_,(Expr *)local_98);
      opc = OVar4;
      if (OVar4 == EXIT) {
        pLVar1 = (in_RSI->lexer_)._M_t.
                 super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                 .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
        this_00 = in_RSI->report_;
        local_90 = p_Var5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Incompatible binary expression operands ({} {} {}).",
                   (allocator<char> *)&stack0xffffffffffffff67);
        args = (**(code **)(*(long *)local_a8._0_8_ + 0x18))();
        args_2 = (**(code **)(*(long *)local_98 + 0x18))();
        diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                  (this_00,&pLVar1->lastLocation_,&local_88,args,Pow,args_2);
        std::__cxx11::string::~string((string *)&local_88);
        p_Var5 = (_Base_ptr)0x0;
      }
      else {
        std::
        make_unique<flow::lang::BinaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                  ((Opcode *)&local_88,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&opc,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_a8)
        ;
        _Var3._M_p = local_88._M_dataplus._M_p;
        uVar2 = local_a8._0_8_;
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_a8._0_8_ = _Var3._M_p;
        if ((tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)uVar2 !=
            (_Head_base<0UL,_flow::lang::Expr_*,_false>)0x0) {
          (**(code **)(*(long *)uVar2 + 8))();
          if ((_Base_ptr)local_88._M_dataplus._M_p != (_Base_ptr)0x0) {
            (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
          }
        }
      }
      if (local_98 != (_Base_ptr)0x0) {
        (**(code **)(*(long *)local_98 + 8))();
      }
    } while (OVar4 != EXIT);
    *(_Base_ptr *)&(this->features_)._M_t._M_impl = p_Var5;
LAB_00121d43:
    if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)0x0) {
      (*((ASTNode *)local_a8._0_8_)->_vptr_ASTNode[1])();
    }
  }
LAB_00121d53:
  std::__cxx11::string::~string((string *)&sloc);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::powExpr() {
  // powExpr ::= negExpr ('**' powExpr)*
  SourceLocation sloc(location());
  std::unique_ptr<Expr> lhs = negExpr();
  if (!lhs) return nullptr;

  while (token() == Token::Pow) {
    nextToken();

    std::unique_ptr<Expr> rhs = powExpr();
    if (!rhs) return nullptr;

    auto opc = makeOperator(Token::Pow, lhs.get(), rhs.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Incompatible binary expression operands ({} {} {}).",
          lhs->getType(), Token::Pow, rhs->getType());
      return nullptr;
    }

    lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
  }

  return lhs;
}